

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

int Gia_ManBmcPerform_Unr(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  Vec_Int_t *p;
  int iVar1;
  Bmc_Mna_t *p_00;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pObj;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  abctime aVar3;
  int iVar4;
  abctime time;
  abctime time_00;
  int iVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  uint local_78;
  int Lit;
  char *local_70;
  uint local_64;
  int local_60;
  int local_5c;
  Unr_Man_t *local_58;
  Bmc_AndPar_t *local_50;
  undefined8 local_48;
  undefined8 local_40;
  ulong local_38;
  
  uVar8 = pPars->nFramesMax;
  p_00 = Bmc_MnaAlloc();
  local_58 = Unr_ManUnrollStart(pGia,pPars->fVeryVerbose);
  iVar5 = 0;
  bVar9 = uVar8 != 0;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  local_64 = 1000000000;
  if (bVar9) {
    local_64 = uVar8;
  }
  local_78 = 0;
  local_50 = pPars;
  do {
    if (local_78 == local_64) goto LAB_0047a190;
    pcVar7 = (char *)(ulong)local_78;
    pGVar2 = Unr_ManUnrollFrame(local_58,local_78);
    p_00->pFrames = pGVar2;
    iVar4 = pGia->vCos->nSize - pGia->nRegs;
    iVar6 = iVar4 * local_78;
    local_78 = local_78 + 1;
    local_70 = pcVar7;
    iVar4 = Gia_ManBmcCheckOutputs(pGVar2,iVar6,iVar4 * local_78);
    uVar8 = 0xfffffffe;
    if (iVar4 == 0) {
      iVar4 = pGia->vCos->nSize - pGia->nRegs;
      iVar5 = (int)local_70;
      Gia_ManBmcAddCone(p_00,iVar4 * iVar5,iVar4 * local_78);
      Gia_ManBmcAddCnf(p_00,p_00->pFrames,p_00->vInputs,p_00->vNodes,p_00->vOutputs);
      iVar4 = pGia->vCos->nSize;
      iVar6 = pGia->nRegs;
      for (iVar5 = (iVar4 - iVar6) * iVar5; iVar5 < (int)((iVar4 - iVar6) * local_78);
          iVar5 = iVar5 + 1) {
        pObj = Gia_ManPo(p_00->pFrames,iVar5);
        if (p_00->pFrames->pObjs !=
            (Gia_Obj_t *)
            ((ulong)((uint)*(undefined8 *)pObj >> 0x1d & 1) ^
            (ulong)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff)))) {
          p = p_00->vId2Var;
          iVar4 = Gia_ObjId(p_00->pFrames,pObj);
          iVar4 = Vec_IntEntry(p,iVar4);
          uVar8 = 0;
          Lit = Abc_Var2Lit(iVar4,0);
          iVar4 = sat_solver_solve(p_00->pSat,&Lit,(lit *)&local_70,(long)pPars->nConfLimit,0,0,0);
          if (iVar4 != -1) {
            if (iVar4 != 1) {
              uVar8 = iVar4 == 0 | 0xfffffffe;
            }
            goto LAB_0047a0b4;
          }
        }
        iVar4 = pGia->vCos->nSize;
        iVar6 = pGia->nRegs;
      }
      uVar8 = 0xfffffffe;
    }
LAB_0047a0b4:
    if (pPars->fVerbose != 0) {
      pGVar2 = p_00->pFrames;
      iVar4 = pGVar2->vCis->nSize;
      iVar6 = pGVar2->nRegs;
      local_5c = Gia_ManAndNum(pGVar2);
      local_60 = p_00->vInputs->nSize;
      local_38 = (ulong)(uint)p_00->vNodes->nSize;
      iVar1 = sat_solver_nclauses(p_00->pSat);
      local_40 = CONCAT44(extraout_var,iVar1);
      iVar1 = sat_solver_nconflicts(p_00->pSat);
      local_48 = CONCAT44(extraout_var_00,iVar1);
      dVar10 = Gia_ManMemory(p_00->pFrames);
      pPars = local_50;
      pcVar7 = local_70;
      printf("%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   "
             ,dVar10 * 9.5367431640625e-07,local_70,(ulong)(uint)(iVar4 - iVar6));
      aVar3 = Abc_Clock();
      Abc_PrintTime((int)aVar3 - (int)p_00->clkStart,pcVar7,time);
    }
  } while (uVar8 == 0xfffffffe);
  if (uVar8 == 0xffffffff) {
    printf("SAT solver reached conflict/runtime limit in frame %d.\n",local_70);
LAB_0047a190:
    iVar5 = -1;
  }
  else {
    pcVar7 = (char *)(ulong)(uint)((pGia->nRegs - pGia->vCos->nSize) * (int)local_70 + iVar5);
    iVar5 = 0;
    printf("Output %d of miter \"%s\" was asserted in frame %d.  ",pcVar7,pGia->pName);
    aVar3 = Abc_Clock();
    Abc_PrintTime((int)aVar3 - (int)p_00->clkStart,pcVar7,time_00);
  }
  if (pPars->fDumpFrames != 0) {
    pGVar2 = Gia_ManCleanup(p_00->pFrames);
    p_00->pFrames = pGVar2;
    Gia_AigerWrite(pGVar2,"frames.aig",0,0,0);
    puts("Dumped unfolded frames into file \"frames.aig\".");
    Gia_ManStop(p_00->pFrames);
  }
  Unr_ManFree(local_58);
  Bmc_MnaFree(p_00);
  return iVar5;
}

Assistant:

int Gia_ManBmcPerform_Unr( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Unr_Man_t * pUnroll;
    Bmc_Mna_t * p;
    int nFramesMax = pPars->nFramesMax ? pPars->nFramesMax : ABC_INFINITY;
    int f, i=0, Lit, status, RetValue = -2;
    p = Bmc_MnaAlloc();
    pUnroll = Unr_ManUnrollStart( pGia, pPars->fVeryVerbose );
    for ( f = 0; f < nFramesMax; f++ )
    {
        p->pFrames = Unr_ManUnrollFrame( pUnroll, f );
        if ( !Gia_ManBmcCheckOutputs( p->pFrames, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) ) )
        {
            // create another slice
            Gia_ManBmcAddCone( p, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) );
            // create CNF in the SAT solver
            Gia_ManBmcAddCnf( p, p->pFrames, p->vInputs, p->vNodes, p->vOutputs );
            // try solving the outputs
            for ( i = f * Gia_ManPoNum(pGia); i < (f+1) * Gia_ManPoNum(pGia); i++ )
            {
                Gia_Obj_t * pObj = Gia_ManPo(p->pFrames, i);
                if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
                    continue;
                Lit = Abc_Var2Lit( Vec_IntEntry(p->vId2Var, Gia_ObjId(p->pFrames, pObj)), 0 );
                status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( status == l_False ) // unsat
                    continue;
                if ( status == l_True ) // sat
                    RetValue = 0;
                if ( status == l_Undef ) // undecided
                    RetValue = -1;
                break;
            }
        }
        // report statistics
        if ( pPars->fVerbose )
        {
            printf( "%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   ", 
                f, Gia_ManPiNum(p->pFrames), Gia_ManAndNum(p->pFrames), 
                p->nSatVars-1, Vec_IntSize(p->vInputs), Vec_IntSize(p->vNodes), 
                sat_solver_nclauses(p->pSat), sat_solver_nconflicts(p->pSat), Gia_ManMemory(p->pFrames)/(1<<20) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
        }
        if ( RetValue != -2 )
        {
            if ( RetValue == -1 )
                printf( "SAT solver reached conflict/runtime limit in frame %d.\n", f );
            else
            {
                printf( "Output %d of miter \"%s\" was asserted in frame %d.  ", 
                    i - f * Gia_ManPoNum(pGia), Gia_ManName(pGia), f );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
            break;
        }
    }
    if ( RetValue == -2 )
        RetValue = -1;
    // dump unfolded frames
    if ( pPars->fDumpFrames )
    {
        p->pFrames = Gia_ManCleanup( p->pFrames );
        Gia_AigerWrite( p->pFrames, "frames.aig", 0, 0, 0 );
        printf( "Dumped unfolded frames into file \"frames.aig\".\n" );
        Gia_ManStop( p->pFrames );
    }
    // cleanup
    Unr_ManFree( pUnroll );
    Bmc_MnaFree( p );
    return RetValue;
}